

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::GetExtkeyInfoResponse::ConvertFromStruct
          (GetExtkeyInfoResponse *this,GetExtkeyInfoResponseStruct *data)

{
  GetExtkeyInfoResponseStruct *data_local;
  GetExtkeyInfoResponse *this_local;
  
  std::__cxx11::string::operator=((string *)&this->network_,(string *)data);
  std::__cxx11::string::operator=((string *)&this->version_,(string *)&data->version);
  this->depth_ = data->depth;
  std::__cxx11::string::operator=((string *)&this->fingerprint_,(string *)&data->fingerprint);
  this->child_number_ = data->child_number;
  std::__cxx11::string::operator=((string *)&this->chain_code_,(string *)&data->chain_code);
  std::__cxx11::string::operator=((string *)&this->key_type_,(string *)&data->key_type);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void GetExtkeyInfoResponse::ConvertFromStruct(
    const GetExtkeyInfoResponseStruct& data) {
  network_ = data.network;
  version_ = data.version;
  depth_ = data.depth;
  fingerprint_ = data.fingerprint;
  child_number_ = data.child_number;
  chain_code_ = data.chain_code;
  key_type_ = data.key_type;
  ignore_items = data.ignore_items;
}